

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageboxbutton.cpp
# Opt level: O2

void __thiscall
QtMWidgets::MsgBoxButton::MsgBoxButton(MsgBoxButton *this,QString *text,QWidget *parent)

{
  MsgBoxButtonPrivate *this_00;
  Object local_30 [8];
  Object local_28 [8];
  
  QAbstractButton::QAbstractButton(&this->super_QAbstractButton,parent);
  *(undefined ***)this = &PTR_metaObject_001a85f8;
  *(undefined ***)&this->field_0x10 = &PTR__MsgBoxButton_001a87c0;
  this_00 = (MsgBoxButtonPrivate *)operator_new(0x28);
  MsgBoxButtonPrivate::MsgBoxButtonPrivate(this_00,text,this);
  (this->d).d = this_00;
  MsgBoxButtonPrivate::init(this_00,(EVP_PKEY_CTX *)text);
  QObject::connect<void(QAbstractButton::*)(),void(QtMWidgets::MsgBoxButton::*)()>
            (local_28,(offset_in_QAbstractButton_to_subr)this,(Object *)QAbstractButton::pressed,0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_28);
  QObject::connect<void(QAbstractButton::*)(),void(QtMWidgets::MsgBoxButton::*)()>
            (local_30,(offset_in_QAbstractButton_to_subr)this,(Object *)QAbstractButton::released,0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  return;
}

Assistant:

MsgBoxButton::MsgBoxButton( const QString & text, QWidget * parent )
	:	QAbstractButton( parent )
	,	d( new MsgBoxButtonPrivate( text, this ) )
{
	d->init();

	connect( this, &QAbstractButton::pressed,
		this, &MsgBoxButton::_q_pressed );

	connect( this, &QAbstractButton::released,
		this, &MsgBoxButton::_q_released );
}